

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOCK5ConnectionMaker.cpp
# Opt level: O2

string * __thiscall
SOCK5ConnectionMaker::getHost_abi_cxx11_(string *__return_storage_ptr__,SOCK5ConnectionMaker *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->addr);
  return __return_storage_ptr__;
}

Assistant:

std::string SOCK5ConnectionMaker::getHost() {
    return addr;
}